

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestParsingMergeLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  MessageLite *pMVar3;
  MessageLite *pMVar4;
  char *failure_msg;
  void *pvVar5;
  int line;
  Arena *arena;
  TestParsingMergeLite *_this;
  TestParsingMergeLite *local_30;
  LogMessageFatal local_28;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestParsingMergeLite *)to_msg;
  local_28.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestParsingMergeLite_const*,proto2_unittest::TestParsingMergeLite*>
                          ((TestParsingMergeLite **)&local_28,&local_30,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom
              (&(local_30->field_0)._impl_.repeated_all_types_,
               (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(from_msg + 3));
    google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup>::
    MergeFrom(&(local_30->field_0)._impl_.repeatedgroup_,
              (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *)
              &from_msg[4]._internal_metadata_);
    uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((uVar2 & 7) != 0) {
      if ((uVar2 & 1) != 0) {
        pMVar3 = (MessageLite *)from_msg[6]._vptr_MessageLite;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.required_all_types_ != nullptr";
          line = 0x229f;
          goto LAB_001a4ad1;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x50);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                             (arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x50) = pvVar5;
        }
        else {
          TestAllTypesLite::MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 2) != 0) {
        pMVar3 = (MessageLite *)from_msg[6]._internal_metadata_.ptr_;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.optional_all_types_ != nullptr";
          line = 0x22a7;
          goto LAB_001a4ad1;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x58);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                             (arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x58) = pvVar5;
        }
        else {
          TestAllTypesLite::MergeImpl(pMVar4,pMVar3);
        }
      }
      if ((uVar2 & 4) != 0) {
        pMVar3 = (MessageLite *)from_msg[7]._vptr_MessageLite;
        if (pMVar3 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.optionalgroup_ != nullptr";
          line = 0x22af;
          goto LAB_001a4ad1;
        }
        pMVar4 = *(MessageLite **)((long)&local_30->field_0 + 0x60);
        if (pMVar4 == (MessageLite *)0x0) {
          pvVar5 = google::protobuf::Arena::
                   CopyConstruct<proto2_unittest::TestParsingMergeLite_OptionalGroup>(arena,pMVar3);
          *(void **)((long)&local_30->field_0 + 0x60) = pvVar5;
        }
        else {
          TestParsingMergeLite_OptionalGroup::MergeImpl(pMVar4,pMVar3);
        }
      }
    }
    pHVar1 = &(local_30->field_0)._impl_._has_bits_;
    pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(local_30->field_0)._impl_._extensions_,
               (MessageLite *)_TestParsingMergeLite_default_instance_,(ExtensionSet *)(from_msg + 1)
              );
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_30->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  line = 0x2294;
LAB_001a4ad1:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void TestParsingMergeLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_all_types()->MergeFrom(
      from._internal_repeated_all_types());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.required_all_types_ != nullptr);
      if (_this->_impl_.required_all_types_ == nullptr) {
        _this->_impl_.required_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.required_all_types_);
      } else {
        _this->_impl_.required_all_types_->MergeFrom(*from._impl_.required_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.optional_all_types_ != nullptr);
      if (_this->_impl_.optional_all_types_ == nullptr) {
        _this->_impl_.optional_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_all_types_);
      } else {
        _this->_impl_.optional_all_types_->MergeFrom(*from._impl_.optional_all_types_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}